

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrieiterator.cpp
# Opt level: O3

Iterator * __thiscall icu_63::UCharsTrie::Iterator::reset(Iterator *this)

{
  ushort uVar1;
  int iVar2;
  char16_t *pcVar3;
  uint uVar4;
  uint uVar5;
  
  pcVar3 = this->initialPos_;
  this->pos_ = pcVar3;
  iVar2 = this->initialRemainingMatchLength_;
  this->remainingMatchLength_ = iVar2;
  this->skipValue_ = '\0';
  uVar5 = this->maxLength_;
  uVar4 = uVar5;
  if (iVar2 < (int)uVar5) {
    uVar4 = iVar2 + 1U;
  }
  if ((int)uVar5 < 1) {
    uVar4 = iVar2 + 1U;
  }
  uVar1 = (this->str_).fUnion.fStackFields.fLengthAndFlags;
  if (((uVar1 & 1) == 0) || (uVar4 != 0)) {
    if ((short)uVar1 < 0) {
      uVar5 = (this->str_).fUnion.fFields.fLength;
    }
    else {
      uVar5 = (int)(short)uVar1 >> 5;
    }
    if (uVar4 < uVar5) {
      if ((int)uVar4 < 0x400) {
        (this->str_).fUnion.fStackFields.fLengthAndFlags = (ushort)(uVar4 << 5) | uVar1 & 0x1f;
      }
      else {
        (this->str_).fUnion.fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
        (this->str_).fUnion.fFields.fLength = uVar4;
      }
    }
  }
  else {
    UnicodeString::unBogus(&this->str_);
    pcVar3 = this->pos_;
    iVar2 = this->remainingMatchLength_;
  }
  this->pos_ = pcVar3 + (int)uVar4;
  this->remainingMatchLength_ = iVar2 - uVar4;
  UVector32::setSize(this->stack_,0);
  return this;
}

Assistant:

UCharsTrie::Iterator &
UCharsTrie::Iterator::reset() {
    pos_=initialPos_;
    remainingMatchLength_=initialRemainingMatchLength_;
    skipValue_=FALSE;
    int32_t length=remainingMatchLength_+1;  // Remaining match length.
    if(maxLength_>0 && length>maxLength_) {
        length=maxLength_;
    }
    str_.truncate(length);
    pos_+=length;
    remainingMatchLength_-=length;
    stack_->setSize(0);
    return *this;
}